

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t slist_size(curl_slist *s,size_t overhead,char *skip)

{
  char *pcVar1;
  size_t sVar2;
  size_t local_38;
  size_t skiplen;
  size_t size;
  char *skip_local;
  size_t overhead_local;
  curl_slist *s_local;
  
  skiplen = 0;
  overhead_local = (size_t)s;
  if (skip == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = strlen(skip);
  }
  for (; overhead_local != 0; overhead_local = *(size_t *)(overhead_local + 8)) {
    if ((skip == (char *)0x0) ||
       (pcVar1 = match_header((curl_slist *)overhead_local,skip,local_38), pcVar1 == (char *)0x0)) {
      sVar2 = strlen(*(char **)overhead_local);
      skiplen = sVar2 + overhead + skiplen;
    }
  }
  return skiplen;
}

Assistant:

static size_t slist_size(struct curl_slist *s,
                         size_t overhead, const char *skip)
{
  size_t size = 0;
  size_t skiplen = skip? strlen(skip): 0;

  for(; s; s = s->next)
    if(!skip || !match_header(s, skip, skiplen))
      size += strlen(s->data) + overhead;
  return size;
}